

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::GridMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  PrimRef *pPVar5;
  undefined1 auVar6 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t t;
  ulong uVar15;
  BufferView<embree::Vec3fa> *pBVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  size_t y_1;
  ulong uVar20;
  unsigned_long uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  ulong local_90;
  size_t local_88;
  size_t local_80;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar21 = r->_begin;
  auVar22._8_4_ = 0x7f800000;
  auVar22._0_8_ = 0x7f8000007f800000;
  auVar22._12_4_ = 0x7f800000;
  auVar23._8_4_ = 0xff800000;
  auVar23._0_8_ = 0xff800000ff800000;
  auVar23._12_4_ = 0xff800000;
  local_88 = 0;
  auVar25._8_4_ = 0xddccb9a2;
  auVar25._0_8_ = 0xddccb9a2ddccb9a2;
  auVar25._12_4_ = 0xddccb9a2;
  auVar27._8_4_ = 0x5dccb9a2;
  auVar27._0_8_ = 0x5dccb9a25dccb9a2;
  auVar27._12_4_ = 0x5dccb9a2;
  auVar24 = ZEXT1664(auVar23);
  auVar26 = ZEXT1664(auVar22);
  auVar28 = ZEXT1664(auVar23);
  auVar29 = ZEXT1664(auVar22);
  local_80 = k;
  do {
    if (r->_end <= uVar21) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar29._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar28._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar26._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar24._0_16_;
      __return_storage_ptr__->end = local_88;
      return __return_storage_ptr__;
    }
    if (uVar21 < *(ulong *)&(this->super_GridMesh).field_0x70) {
      lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
      uVar17 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
      lVar14 = *(long *)&(this->super_GridMesh).field_0x68 * uVar21;
      uVar12 = (ulong)*(uint *)(lVar4 + lVar14);
      if (uVar12 < uVar17) {
        uVar2 = *(ushort *)(lVar4 + 10 + lVar14);
        uVar15 = (ulong)uVar2;
        uVar11 = *(uint *)(lVar4 + 4 + lVar14);
        uVar3 = *(ushort *)(lVar4 + 8 + lVar14);
        local_90 = (ulong)uVar3;
        if (((uint)uVar3 + uVar11 * (uVar2 - 1) + *(uint *)(lVar4 + lVar14)) - 1 < uVar17) {
          pBVar16 = (this->super_GridMesh).vertices.items;
          for (uVar17 = 0; uVar18 = uVar12, uVar20 = local_90, uVar17 != uVar15; uVar17 = uVar17 + 1
              ) {
            while (uVar20 != 0) {
              auVar1 = *(undefined1 (*) [16])
                        ((pBVar16->super_RawBufferView).ptr_ofs +
                        (pBVar16->super_RawBufferView).stride * uVar18);
              auVar32 = vcmpps_avx(auVar1,auVar25,6);
              auVar1 = vcmpps_avx(auVar1,auVar27,1);
              auVar1 = vandps_avx(auVar32,auVar1);
              uVar19 = vmovmskps_avx(auVar1);
              uVar18 = uVar18 + 1;
              uVar20 = uVar20 - 1;
              if ((~(byte)uVar19 & 7) != 0) goto LAB_00bf3bd5;
            }
            uVar12 = uVar12 + uVar11;
          }
          uVar17 = 0;
LAB_00bf3bf5:
          uVar11 = (uint)uVar17;
          if (uVar11 < (int)uVar15 - 1U) {
            uVar9 = 0;
            do {
              uVar10 = uVar9;
LAB_00bf3c27:
              if ((ushort)local_90 - 1 <= uVar10) {
                uVar15 = (ulong)*(ushort *)(lVar4 + 10 + lVar14);
                uVar17 = (ulong)(uVar11 + 2);
                goto LAB_00bf3bf5;
              }
              uVar12 = (ulong)uVar10 + 3;
              if (local_90 <= uVar12) {
                uVar12 = local_90;
              }
              auVar31 = ZEXT1664(auVar22);
              auVar30 = ZEXT1664(auVar23);
              for (uVar15 = 0; uVar15 != (this->super_GridMesh).super_Geometry.numTimeSteps;
                  uVar15 = uVar15 + 1) {
                uVar18 = (ulong)*(ushort *)(lVar4 + 10 + lVar14);
                if (uVar17 + 3 < uVar18) {
                  uVar18 = uVar17 + 3;
                }
                pBVar16 = (this->super_GridMesh).vertices.items + uVar15;
                for (uVar20 = uVar17; uVar13 = (ulong)uVar10, uVar20 < uVar18; uVar20 = uVar20 + 1)
                {
                  for (; uVar13 < uVar12; uVar13 = uVar13 + 1) {
                    auVar1 = *(undefined1 (*) [16])
                              ((pBVar16->super_RawBufferView).ptr_ofs +
                              (*(uint *)(lVar4 + lVar14) + uVar13 +
                              *(uint *)(lVar4 + 4 + lVar14) * uVar20) *
                              (pBVar16->super_RawBufferView).stride);
                    auVar32 = vcmpps_avx(auVar1,auVar25,6);
                    auVar6 = vcmpps_avx(auVar1,auVar27,1);
                    auVar32 = vandps_avx(auVar32,auVar6);
                    uVar19 = vmovmskps_avx(auVar32);
                    if ((~(byte)uVar19 & 7) != 0) {
                      uVar10 = uVar10 + 2;
                      goto LAB_00bf3c27;
                    }
                    auVar32 = vminps_avx(auVar31._0_16_,auVar1);
                    auVar31 = ZEXT1664(auVar32);
                    auVar1 = vmaxps_avx(auVar30._0_16_,auVar1);
                    auVar30 = ZEXT1664(auVar1);
                  }
                }
              }
              aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar31._0_16_,ZEXT416(geomID),0x30);
              aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar30._0_16_,ZEXT416((uint)local_80),0x30);
              auVar1 = vminps_avx(auVar29._0_16_,(undefined1  [16])aVar7);
              auVar29 = ZEXT1664(auVar1);
              auVar1 = vmaxps_avx(auVar28._0_16_,(undefined1  [16])aVar8);
              auVar28 = ZEXT1664(auVar1);
              auVar32._0_4_ = aVar7.x + aVar8.x;
              auVar32._4_4_ = aVar7.y + aVar8.y;
              auVar32._8_4_ = aVar7.z + aVar8.z;
              auVar32._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
              auVar1 = vminps_avx(auVar26._0_16_,auVar32);
              auVar26 = ZEXT1664(auVar1);
              auVar1 = vmaxps_avx(auVar24._0_16_,auVar32);
              auVar24 = ZEXT1664(auVar1);
              local_88 = local_88 + 1;
              uVar9 = uVar10 + 2;
              sgrids->items[local_80] =
                   (SubGridBuildData)
                   ((ulong)(uVar10 & 0xfffe | (uint)((ushort)local_90 <= uVar9) << 0xf) |
                    uVar21 << 0x20 |
                   (ulong)(uVar11 << 0x10 |
                          (uint)((uint)*(ushort *)(lVar4 + 10 + lVar14) <= uVar11 + 2) << 0x1f));
              pPVar5 = prims->items;
              pPVar5[local_80].upper.field_0.field_1 = aVar8;
              pPVar5[local_80].lower.field_0.field_1 = aVar7;
              local_90 = (ulong)*(ushort *)(lVar4 + 8 + lVar14);
              local_80 = local_80 + 1;
            } while( true );
          }
        }
      }
    }
LAB_00bf3bd5:
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids, const range<size_t>& r, size_t k, unsigned int geomID) const override 
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j)) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              BBox3fa bounds = empty;
              if (!buildBounds(g,x,y,bounds)) continue; // get bounds of subgrid
              const PrimRef prim(bounds,(unsigned)geomID,(unsigned)k);
              pinfo.add_center2(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;                
            }
          }
        }
        return pinfo;
      }